

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

void crnlib::DitherBlock(color_quad_u8 *dest,color_quad_u8 *block)

{
  long in_RSI;
  long in_RDI;
  int y;
  uint8 *dp;
  uint8 *bp;
  int ch;
  uint8 *quant;
  int *ep2;
  int *ep1;
  int err [8];
  int local_6c;
  byte *local_68;
  byte *local_60;
  int local_54;
  int *local_48;
  int *local_40;
  int local_38 [4];
  int local_28 [6];
  long local_10;
  long local_8;
  
  local_40 = local_38;
  local_48 = local_28;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    local_60 = (byte *)(local_10 + local_54);
    local_68 = (byte *)(local_8 + local_54);
    memset(local_38,0,0x20);
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      *local_68 = ryg_dxt::QuantRBTab
                  [(long)(int)((uint)*local_60 + (local_48[1] * 3 + *local_48 * 5 >> 4)) + 8];
      *local_40 = (uint)*local_60 - (uint)*local_68;
      local_68[4] = ryg_dxt::QuantRBTab
                    [(long)(int)((uint)local_60[4] +
                                (*local_40 * 7 + local_48[2] * 3 + local_48[1] * 5 + *local_48 >> 4)
                                ) + 8];
      local_40[1] = (uint)local_60[4] - (uint)local_68[4];
      local_68[8] = ryg_dxt::QuantRBTab
                    [(long)(int)((uint)local_60[8] +
                                (local_40[1] * 7 + local_48[3] * 3 + local_48[2] * 5 + local_48[1]
                                >> 4)) + 8];
      local_40[2] = (uint)local_60[8] - (uint)local_68[8];
      local_68[0xc] =
           ryg_dxt::QuantRBTab
           [(long)(int)((uint)local_60[0xc] + (local_40[2] * 7 + local_48[3] * 5 + local_48[2] >> 4)
                       ) + 8];
      local_40[3] = (uint)local_60[0xc] - (uint)local_68[0xc];
      std::swap<int*>(&local_40,&local_48);
      local_60 = local_60 + 0x10;
      local_68 = local_68 + 0x10;
    }
  }
  return;
}

Assistant:

static void DitherBlock(color_quad_u8* dest, const color_quad_u8* block) {
  int err[8], *ep1 = err, *ep2 = err + 4;
  uint8* quant = ryg_dxt::QuantRBTab + 8;

  // process channels seperately
  for (int ch = 0; ch < 3; ch++) {
    uint8* bp = (uint8*)block;
    uint8* dp = (uint8*)dest;

    bp += ch;
    dp += ch;
    memset(err, 0, sizeof(err));

    for (int y = 0; y < 4; y++) {
      // pixel 0
      dp[0] = quant[bp[0] + ((3 * ep2[1] + 5 * ep2[0]) >> 4)];
      ep1[0] = bp[0] - dp[0];

      // pixel 1
      dp[4] = quant[bp[4] + ((7 * ep1[0] + 3 * ep2[2] + 5 * ep2[1] + ep2[0]) >> 4)];
      ep1[1] = bp[4] - dp[4];

      // pixel 2
      dp[8] = quant[bp[8] + ((7 * ep1[1] + 3 * ep2[3] + 5 * ep2[2] + ep2[1]) >> 4)];
      ep1[2] = bp[8] - dp[8];

      // pixel 3
      dp[12] = quant[bp[12] + ((7 * ep1[2] + 5 * ep2[3] + ep2[2]) >> 4)];
      ep1[3] = bp[12] - dp[12];

      // advance to next line
      std::swap(ep1, ep2);
      bp += 16;
      dp += 16;
    }
  }
}